

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

bool __thiscall cmCPackGenerator::ReadListFile(cmCPackGenerator *this,char *moduleName)

{
  cmMakefile *this_00;
  bool bVar1;
  string fullPath;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  this_00 = this->MakefileMap;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,moduleName,&local_51);
  cmMakefile::GetModulesFile(&local_30,this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = cmMakefile::ReadListFile(this->MakefileMap,&local_30);
  if (bVar1) {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool cmCPackGenerator::ReadListFile(const char* moduleName)
{
  bool retval;
  std::string fullPath = this->MakefileMap->GetModulesFile(moduleName);
  retval = this->MakefileMap->ReadListFile(fullPath);
  // include FATAL_ERROR and ERROR in the return status
  retval = retval && (!cmSystemTools::GetErrorOccurredFlag());
  return retval;
}